

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

ImGuiTabItem * ImGui::TabBarFindMostRecentlySelectedTabForActiveWindow(ImGuiTabBar *tab_bar)

{
  ImGuiTabItem *pIVar1;
  int tab_n;
  int i;
  ImGuiTabItem *pIVar2;
  
  pIVar2 = (ImGuiTabItem *)0x0;
  for (i = 0; i < (tab_bar->Tabs).Size; i = i + 1) {
    pIVar1 = ImVector<ImGuiTabItem>::operator[](&tab_bar->Tabs,i);
    if ((((pIVar2 == (ImGuiTabItem *)0x0) || (pIVar2->LastFrameSelected < pIVar1->LastFrameSelected)
         ) && (pIVar1->Window != (ImGuiWindow *)0x0)) && (pIVar1->Window->WasActive != false)) {
      pIVar2 = pIVar1;
    }
  }
  return pIVar2;
}

Assistant:

ImGuiTabItem* ImGui::TabBarFindMostRecentlySelectedTabForActiveWindow(ImGuiTabBar* tab_bar)
{
    ImGuiTabItem* most_recently_selected_tab = NULL;
    for (int tab_n = 0; tab_n < tab_bar->Tabs.Size; tab_n++)
    {
        ImGuiTabItem* tab = &tab_bar->Tabs[tab_n];
        if (most_recently_selected_tab == NULL || most_recently_selected_tab->LastFrameSelected < tab->LastFrameSelected)
            if (tab->Window && tab->Window->WasActive)
                most_recently_selected_tab = tab;
    }
    return most_recently_selected_tab;
}